

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_port_resp(connectdata *conn,int ftpcode)

{
  int iVar1;
  SessionHandle *data;
  CURLcode CVar2;
  ftpport fcmd;
  
  data = conn->data;
  if (ftpcode == 200) {
    Curl_infof(data,"Connect data stream actively\n");
    (conn->proto).ftpc.state = FTP_STOP;
    CVar2 = ftp_dophase_done(conn,false);
    return CVar2;
  }
  iVar1 = (conn->proto).ftpc.count1;
  if (iVar1 == 0) {
    Curl_infof(data,"disabling EPRT usage\n");
    (conn->bits).ftp_use_eprt = false;
    fcmd = PORT;
  }
  else {
    fcmd = iVar1 + PORT;
    if (fcmd == DONE) {
      Curl_failf(data,"Failed to do PORT");
      return CURLE_FTP_PORT_FAILED;
    }
  }
  CVar2 = ftp_state_use_port(conn,fcmd);
  return CVar2;
}

Assistant:

static CURLcode ftp_state_port_resp(struct connectdata *conn,
                                    int ftpcode)
{
  struct SessionHandle *data = conn->data;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  ftpport fcmd = (ftpport)ftpc->count1;
  CURLcode result = CURLE_OK;

  if(ftpcode != 200) {
    /* the command failed */

    if(EPRT == fcmd) {
      infof(data, "disabling EPRT usage\n");
      conn->bits.ftp_use_eprt = FALSE;
    }
    fcmd++;

    if(fcmd == DONE) {
      failf(data, "Failed to do PORT");
      result = CURLE_FTP_PORT_FAILED;
    }
    else
      /* try next */
      result = ftp_state_use_port(conn, fcmd);
  }
  else {
    infof(data, "Connect data stream actively\n");
    state(conn, FTP_STOP); /* end of DO phase */
    result = ftp_dophase_done(conn, FALSE);
  }

  return result;
}